

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor *c)

{
  (*c->_vptr_ICompressor[1])(c,0xffffffd6,0xf,8,0);
  (**(code **)(*test_suite::detail::current()::p + 0x30))
            (test_suite::detail::current()::p,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1b6,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  (*c->_vptr_ICompressor[1])(c,0xffffffff,0xffffffff,8,0);
  (**(code **)(*test_suite::detail::current()::p + 0x30))
            (test_suite::detail::current()::p,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1b9,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  (*c->_vptr_ICompressor[1])(c,0xffffffff,0xf,0xffffffff,0);
  (**(code **)(*test_suite::detail::current()::p + 0x30))
            (test_suite::detail::current()::p,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1bc,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  (**c->_vptr_ICompressor)(c);
  (*c->_vptr_ICompressor[3])(c,1);
  (*c->_vptr_ICompressor[5])(c,0);
  (*c->_vptr_ICompressor[0xc])(c,4);
  (**(code **)(*test_suite::detail::current()::p + 0x30))
            (test_suite::detail::current()::p,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1c5,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  return;
}

Assistant:

static
    void testInvalidSettings(ICompressor& c)
    {
        BOOST_TEST_THROWS(
            c.init(-42, 15, 8, static_cast<int>(Strategy::normal)), 
            std::invalid_argument);
        BOOST_TEST_THROWS(
            c.init(compression::default_size, -1, 8, static_cast<int>(Strategy::normal)),
            std::invalid_argument);
        BOOST_TEST_THROWS(
            c.init(compression::default_size, 15, -1, static_cast<int>(Strategy::normal)),
            std::invalid_argument);

        BOOST_TEST_THROWS(
            [&]()
            {
                c.init();
                c.avail_in(1);
                c.next_in(nullptr);
                c.write(Flush::full);
            }(), std::invalid_argument);
    }